

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.cpp
# Opt level: O2

void __thiscall
phyr::PixelSampler::PixelSampler(PixelSampler *this,int64_t samplesPerPixel,int nSampledDimensions)

{
  int iVar1;
  bool bVar2;
  allocator_type local_51;
  PixelSampler *local_50;
  _Vector_base<phyr::Point2<double>,_std::allocator<phyr::Point2<double>_>_> local_48;
  
  (this->super_Sampler).samplesPerPixel = samplesPerPixel;
  (this->super_Sampler).currentPixel.x = 0;
  (this->super_Sampler).currentPixel.y = 0;
  (this->super_Sampler).samples1DArraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Sampler).samples1DArraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Sampler).samples1DArraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Sampler).samples2DArraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Sampler).samples2DArraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Sampler).samples2DArraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Sampler).sampleArray1D.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Sampler).sampleArray1D.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Sampler).sampleArray1D.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Sampler).sampleArray2D.
  super__Vector_base<std::vector<phyr::Point2<double>,_std::allocator<phyr::Point2<double>_>_>,_std::allocator<std::vector<phyr::Point2<double>,_std::allocator<phyr::Point2<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Sampler).sampleArray2D.
  super__Vector_base<std::vector<phyr::Point2<double>,_std::allocator<phyr::Point2<double>_>_>,_std::allocator<std::vector<phyr::Point2<double>,_std::allocator<phyr::Point2<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Sampler).sampleArray2D.
  super__Vector_base<std::vector<phyr::Point2<double>,_std::allocator<phyr::Point2<double>_>_>,_std::allocator<std::vector<phyr::Point2<double>,_std::allocator<phyr::Point2<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Sampler)._vptr_Sampler = (_func_int **)&PTR__PixelSampler_00198b48;
  (this->samples1D).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->samples1D).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->samples1D).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->samples2D).
  super__Vector_base<std::vector<phyr::Point2<double>,_std::allocator<phyr::Point2<double>_>_>,_std::allocator<std::vector<phyr::Point2<double>,_std::allocator<phyr::Point2<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->samples2D).
  super__Vector_base<std::vector<phyr::Point2<double>,_std::allocator<phyr::Point2<double>_>_>,_std::allocator<std::vector<phyr::Point2<double>,_std::allocator<phyr::Point2<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->samples2D).
  super__Vector_base<std::vector<phyr::Point2<double>,_std::allocator<phyr::Point2<double>_>_>,_std::allocator<std::vector<phyr::Point2<double>,_std::allocator<phyr::Point2<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->current1DDimension = 0;
  this->current2DDimension = 0;
  (this->rng).state = 0x853c49e6748fea9b;
  (this->rng).inc = 0xda3e39cb94b95bdb;
  iVar1 = 0;
  if (0 < nSampledDimensions) {
    iVar1 = nSampledDimensions;
  }
  local_50 = this;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_48,samplesPerPixel,&local_51);
    std::
    vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
    ::emplace_back<std::vector<double,std::allocator<double>>>
              ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                *)&this->samples1D,(vector<double,_std::allocator<double>_> *)&local_48);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_48);
    std::vector<phyr::Point2<double>,_std::allocator<phyr::Point2<double>_>_>::vector
              ((vector<phyr::Point2<double>,_std::allocator<phyr::Point2<double>_>_> *)&local_48,
               samplesPerPixel,(allocator_type *)&local_51);
    std::
    vector<std::vector<phyr::Point2<double>,std::allocator<phyr::Point2<double>>>,std::allocator<std::vector<phyr::Point2<double>,std::allocator<phyr::Point2<double>>>>>
    ::emplace_back<std::vector<phyr::Point2<double>,std::allocator<phyr::Point2<double>>>>
              ((vector<std::vector<phyr::Point2<double>,std::allocator<phyr::Point2<double>>>,std::allocator<std::vector<phyr::Point2<double>,std::allocator<phyr::Point2<double>>>>>
                *)&this->samples2D,
               (vector<phyr::Point2<double>,_std::allocator<phyr::Point2<double>_>_> *)&local_48);
    std::_Vector_base<phyr::Point2<double>,_std::allocator<phyr::Point2<double>_>_>::~_Vector_base
              (&local_48);
  }
  return;
}

Assistant:

PixelSampler::PixelSampler(int64_t samplesPerPixel, int nSampledDimensions)
    : Sampler(samplesPerPixel),
      current1DDimension(0), current2DDimension(0) {
    for (int i = 0; i < nSampledDimensions; i++) {
        samples1D.push_back(std::vector<Real>(samplesPerPixel));
        samples2D.push_back(std::vector<Point2f>(samplesPerPixel));
    }
}